

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O3

string * __thiscall
HevcSpsUnit::getDescription_abi_cxx11_(string *__return_storage_ptr__,HevcSpsUnit *this)

{
  ulong *puVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  double fps;
  string local_118;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  string local_98;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  string local_58;
  ulong *local_38;
  
  HevcUnitWithProfile::getProfileString_abi_cxx11_
            (__return_storage_ptr__,&this->super_HevcUnitWithProfile);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," Resolution: ","");
  int32uToStr_abi_cxx11_(&local_58,&this->pic_width_in_luma_samples);
  uVar5 = 0xf;
  if (local_b8 != local_a8) {
    uVar5 = local_a8[0];
  }
  if (uVar5 < local_58._M_string_length + local_b0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar6 = local_58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_58._M_string_length + local_b0) goto LAB_00189fc5;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00189fc5:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_58._M_dataplus._M_p);
  }
  local_d8 = &local_c8;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_c8 = *puVar1;
    uStack_c0 = puVar4[3];
  }
  else {
    local_c8 = *puVar1;
    local_d8 = (ulong *)*puVar4;
  }
  local_d0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,":","");
  uVar5 = 0xf;
  if (local_d8 != &local_c8) {
    uVar5 = local_c8;
  }
  if (uVar5 < (ulong)(local_70 + local_d0)) {
    uVar5 = 0xf;
    if (local_78 != local_68) {
      uVar5 = local_68[0];
    }
    if (uVar5 < (ulong)(local_70 + local_d0)) goto LAB_0018a09f;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_0018a09f:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78);
  }
  local_f8 = &local_e8;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_e8 = *puVar1;
    uStack_e0 = puVar4[3];
  }
  else {
    local_e8 = *puVar1;
    local_f8 = (ulong *)*puVar4;
  }
  local_f0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  int32uToStr_abi_cxx11_(&local_98,&this->pic_height_in_luma_samples);
  uVar5 = 0xf;
  if (local_f8 != &local_e8) {
    uVar5 = local_e8;
  }
  if (uVar5 < local_98._M_string_length + local_f0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar6 = local_98.field_2._M_allocated_capacity;
    }
    if (local_98._M_string_length + local_f0 <= (ulong)uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_f8);
      goto LAB_0018a187;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_98._M_dataplus._M_p);
LAB_0018a187:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_118.field_2._M_allocated_capacity = *psVar2;
    local_118.field_2._8_8_ = puVar4[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar2;
    local_118._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_118._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_118._M_dataplus._M_p);
  paVar3 = &local_118.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar3) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_118._M_dataplus._M_p = (pointer)paVar3;
  if ((this->super_HevcUnitWithProfile).interlaced_source_flag == true) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"i","");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"p","");
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_118._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar3) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_f8 = (ulong *)0x0;
  if (this->num_units_in_tick != 0) {
    local_f8 = (ulong *)((double)this->time_scale / (double)this->num_units_in_tick);
  }
  local_38 = local_f8;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (((double)local_38 != 0.0) || (NAN((double)local_38))) {
    doubleToStr_abi_cxx11_(&local_118,(double *)&local_f8,-1);
  }
  else {
    local_118._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"not found","");
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_118._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar3) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string HevcSpsUnit::getDescription() const
{
    string result = getProfileString();
    result += string(" Resolution: ") + int32uToStr(pic_width_in_luma_samples) + string(":") +
              int32uToStr(pic_height_in_luma_samples);
    result += interlaced_source_flag ? string("i") : string("p");

    const double fps = getFPS();
    result += "  Frame rate: ";
    result += fps != 0.0 ? doubleToStr(fps) : string("not found");
    return result;
}